

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_downward.h
# Opt level: O1

void __thiscall
flatbuffers::vector_downward<unsigned_int>::fill
          (vector_downward<unsigned_int> *this,size_t zero_pad_bytes)

{
  size_t sVar1;
  
  if (zero_pad_bytes != 0) {
    ensure_space(this,zero_pad_bytes);
    this->cur_ = this->cur_ + -zero_pad_bytes;
    this->size_ = this->size_ + (int)zero_pad_bytes;
    sVar1 = 0;
    do {
      this->cur_[sVar1] = '\0';
      sVar1 = sVar1 + 1;
    } while (zero_pad_bytes != sVar1);
  }
  return;
}

Assistant:

void fill(size_t zero_pad_bytes) {
    make_space(zero_pad_bytes);
    for (size_t i = 0; i < zero_pad_bytes; i++) cur_[i] = 0;
  }